

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_simplifier.cc
# Opt level: O2

bool __thiscall
S2PolylineSimplifier::AvoidDisc
          (S2PolylineSimplifier *this,S2Point *p,S1ChordAngle r,bool disc_on_left)

{
  double dVar1;
  double dVar2;
  double lo;
  byte bVar3;
  double hi;
  S1Interval SVar4;
  S1Interval target;
  S1Interval local_28;
  
  dVar1 = GetSemiwidth(this,p,r,1);
  if (3.141592653589793 <= dVar1) {
    (this->window_).bounds_.c_[0] = 3.141592653589793;
    (this->window_).bounds_.c_[1] = -3.141592653589793;
    bVar3 = 0;
  }
  else {
    dVar2 = GetAngle(this,p);
    hi = dVar2 + *(double *)(&DAT_00278390 + (ulong)(0.0 < dVar2) * 8);
    lo = dVar2;
    if (disc_on_left) {
      lo = hi;
      hi = dVar2;
    }
    S1Interval::S1Interval(&target,lo,hi);
    local_28 = S1Interval::Expanded(&target,-dVar1);
    SVar4 = S1Interval::Intersection(&this->window_,&local_28);
    *(Vector2_d *)(this->window_).bounds_.c_ = SVar4.bounds_.c_;
    bVar3 = -(SVar4.bounds_.c_[0] != 3.141592653589793) |
            -(SVar4.bounds_.c_[1] != -3.141592653589793);
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool S2PolylineSimplifier::AvoidDisc(const S2Point& p, S1ChordAngle r,
                                     bool disc_on_left) {
  // Expand the interval by the maximum error from all sources.  This
  // guarantees that the final output edge will avoid the given disc.
  double semiwidth = GetSemiwidth(p, r, 1 /*round up*/);
  if (semiwidth >= M_PI) {
    // The avoidance disc contains "src", so it is impossible to avoid.
    window_ = S1Interval::Empty();
    return false;
  }
  double center = GetAngle(p);
  double opposite = (center > 0) ? center - M_PI : center + M_PI;
  S1Interval target = (disc_on_left ? S1Interval(opposite, center) :
                       S1Interval(center, opposite));
  window_ = window_.Intersection(target.Expanded(-semiwidth));
  return !window_.is_empty();
}